

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O3

int run_test_handle_fileno(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b_13;
  uv_os_fd_t fd;
  int64_t eval_b_18;
  uv_tty_t tty;
  uv_pipe_t pipe;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tcp_t tcp;
  long local_420;
  undefined1 local_414 [4];
  long local_410;
  long local_408 [35];
  undefined8 local_2f0 [29];
  undefined1 local_208 [16];
  undefined1 local_1f8 [88];
  undefined1 local_1a0 [184];
  undefined1 local_e8 [216];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_208);
  local_408[0] = (long)iVar1;
  local_2f0[0] = 0;
  if (local_408[0] == 0) {
    iVar1 = uv_idle_init(uVar2,local_1f8);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f462;
    iVar1 = uv_fileno(local_1f8,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0xffffffffffffffea;
    if (local_408[0] != -0x16) goto LAB_0019f474;
    uv_close(local_1f8,0);
    iVar1 = uv_tcp_init(uVar2,local_e8);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f486;
    iVar1 = uv_fileno(local_e8,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0xfffffffffffffff7;
    if (local_408[0] != -9) goto LAB_0019f498;
    iVar1 = uv_tcp_bind(local_e8,local_208,0);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f4aa;
    iVar1 = uv_fileno(local_e8,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f4bc;
    uv_close(local_e8,0);
    iVar1 = uv_fileno(local_e8,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0xfffffffffffffff7;
    if (local_408[0] != -9) goto LAB_0019f4ce;
    iVar1 = uv_udp_init(uVar2,local_1a0);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f4e0;
    iVar1 = uv_fileno(local_1a0,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0xfffffffffffffff7;
    if (local_408[0] != -9) goto LAB_0019f4f2;
    iVar1 = uv_udp_bind(local_1a0,local_208,0);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f504;
    iVar1 = uv_fileno(local_1a0,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0;
    if (local_408[0] != 0) goto LAB_0019f516;
    uv_close(local_1a0,0);
    iVar1 = uv_fileno(local_1a0,local_414);
    local_408[0] = (long)iVar1;
    local_2f0[0] = 0xfffffffffffffff7;
    if (local_408[0] != -9) goto LAB_0019f528;
    iVar1 = uv_pipe_init(uVar2,local_2f0,0);
    local_408[0] = (long)iVar1;
    local_420 = 0;
    if (local_408[0] != 0) goto LAB_0019f53a;
    iVar1 = uv_fileno(local_2f0,local_414);
    local_408[0] = (long)iVar1;
    local_420 = -9;
    if (local_408[0] != -9) goto LAB_0019f549;
    iVar1 = uv_pipe_bind(local_2f0,"/tmp/uv-test-sock");
    local_408[0] = (long)iVar1;
    local_420 = 0;
    if (local_408[0] != 0) goto LAB_0019f558;
    iVar1 = uv_fileno(local_2f0,local_414);
    local_408[0] = (long)iVar1;
    local_420 = 0;
    if (local_408[0] != 0) goto LAB_0019f567;
    uv_close(local_2f0,0);
    iVar1 = uv_fileno(local_2f0);
    local_408[0] = (long)iVar1;
    local_420 = -9;
    if (local_408[0] != -9) goto LAB_0019f576;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 == -1) {
      run_test_handle_fileno_cold_26();
LAB_0019f3ea:
      uv_run(uVar2,0);
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_420 = 0;
      iVar1 = uv_loop_close(uVar2);
      local_410 = (long)iVar1;
      if (local_420 == local_410) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019f585;
    }
    iVar1 = uv_tty_init(uVar2,local_408,iVar1,0);
    local_420 = (long)iVar1;
    local_410 = 0;
    if (local_420 != 0) goto LAB_0019f594;
    iVar1 = uv_is_readable(local_408);
    if (iVar1 == 0) goto LAB_0019f5a3;
    iVar1 = uv_is_writable(local_408);
    if (iVar1 != 0) goto LAB_0019f5a8;
    iVar1 = uv_fileno(local_408,local_414);
    local_420 = (long)iVar1;
    local_410 = 0;
    if (local_420 != 0) goto LAB_0019f5ad;
    uv_close(local_408,0);
    iVar1 = uv_fileno(local_408,local_414);
    local_420 = (long)iVar1;
    local_410 = -9;
    if (local_420 != -9) goto LAB_0019f5bc;
    plVar3 = local_408;
    iVar1 = uv_is_readable(plVar3);
    if (iVar1 == 0) {
      plVar3 = local_408;
      iVar1 = uv_is_writable(plVar3);
      if (iVar1 != 0) goto LAB_0019f5d0;
      goto LAB_0019f3ea;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0019f462:
    run_test_handle_fileno_cold_2();
LAB_0019f474:
    run_test_handle_fileno_cold_3();
LAB_0019f486:
    run_test_handle_fileno_cold_4();
LAB_0019f498:
    run_test_handle_fileno_cold_5();
LAB_0019f4aa:
    run_test_handle_fileno_cold_6();
LAB_0019f4bc:
    run_test_handle_fileno_cold_7();
LAB_0019f4ce:
    run_test_handle_fileno_cold_8();
LAB_0019f4e0:
    run_test_handle_fileno_cold_9();
LAB_0019f4f2:
    run_test_handle_fileno_cold_10();
LAB_0019f504:
    run_test_handle_fileno_cold_11();
LAB_0019f516:
    run_test_handle_fileno_cold_12();
LAB_0019f528:
    run_test_handle_fileno_cold_13();
LAB_0019f53a:
    run_test_handle_fileno_cold_14();
LAB_0019f549:
    run_test_handle_fileno_cold_15();
LAB_0019f558:
    run_test_handle_fileno_cold_16();
LAB_0019f567:
    run_test_handle_fileno_cold_17();
LAB_0019f576:
    run_test_handle_fileno_cold_18();
LAB_0019f585:
    run_test_handle_fileno_cold_27();
LAB_0019f594:
    run_test_handle_fileno_cold_19();
LAB_0019f5a3:
    run_test_handle_fileno_cold_25();
LAB_0019f5a8:
    run_test_handle_fileno_cold_20();
LAB_0019f5ad:
    run_test_handle_fileno_cold_21();
LAB_0019f5bc:
    plVar3 = &local_420;
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0019f5d0:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  uv_os_fd_t tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT_EQ(r, UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd == (uv_os_fd_t)-1) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT_OK(r);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_OK(r);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_EQ(r, UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}